

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O2

void __thiscall
json11::Value<(json11::Json::Type)1,_double>::dump
          (Value<(json11::Json::Type)1,_double> *this,string *out)

{
  char acStack_38 [40];
  
  if (0x7fefffffffffffff < (ulong)ABS(this->m_value)) {
    std::__cxx11::string::append((char *)out);
    return;
  }
  snprintf(acStack_38,0x20,"%.17g");
  std::__cxx11::string::append((char *)out);
  return;
}

Assistant:

void dump(string &out) const override { json11::dump(m_value, out); }